

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O3

_Bool sasl_digest_get_key_value(char *chlg,char *key,char *value,size_t max_val_len,char end_char)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  char cVar4;
  
  pcVar1 = strstr(chlg,key);
  if (pcVar1 != (char *)0x0) {
    sVar2 = strlen(key);
    cVar4 = pcVar1[sVar2];
    if (max_val_len == 1 || (cVar4 == end_char || cVar4 == '\0')) {
      uVar3 = 0;
    }
    else {
      uVar3 = 0;
      do {
        value[uVar3] = cVar4;
        cVar4 = pcVar1[uVar3 + sVar2 + 1];
        uVar3 = uVar3 + 1;
        if ((cVar4 == '\0') || (cVar4 == end_char)) break;
      } while (uVar3 < max_val_len - 1);
    }
    value[uVar3] = '\0';
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

static bool sasl_digest_get_key_value(const char *chlg,
                                      const char *key,
                                      char *value,
                                      size_t max_val_len,
                                      char end_char)
{
  char *find_pos;
  size_t i;

  find_pos = strstr(chlg, key);
  if(!find_pos)
    return FALSE;

  find_pos += strlen(key);

  for(i = 0; *find_pos && *find_pos != end_char && i < max_val_len - 1; ++i)
    value[i] = *find_pos++;
  value[i] = '\0';

  return TRUE;
}